

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O0

void __thiscall Shell::NewCNF::Occurrences::replaceBy(Occurrences *this,Formula *f)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  Connective CVar4;
  int iVar5;
  GenClause *pGVar6;
  pair<Kernel::Formula_*,_bool> *gl_00;
  Formula **ppFVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Formula *tbs;
  size_t *siglen;
  size_t *siglen_00;
  Formula *in_RSI;
  uchar *sig;
  size_t in_R8;
  GenLit *gl;
  Occurrence occ;
  Literal *l;
  bool negateOccurrenceSign;
  Iterator occit;
  Occurrences *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  Iterator *in_stack_ffffffffffffff38;
  Iterator *in_stack_ffffffffffffff98;
  uint local_60;
  Formula *local_10;
  
  Iterator::Iterator((Iterator *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28);
  bVar1 = false;
  CVar4 = Kernel::Formula::connective(in_RSI);
  local_10 = in_RSI;
  if (CVar4 == LITERAL) {
    Kernel::Formula::literal((Formula *)0xbe1907);
    bVar2 = Kernel::Term::shared((Term *)0xbe1928);
    if ((bVar2) && (iVar5 = Kernel::Literal::polarity((Literal *)0xbe1948), iVar5 == 0)) {
      local_10 = (Formula *)Kernel::AtomicFormula::operator_new(0xbe1970);
      Kernel::Literal::complementaryLiteral
                ((Literal *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      Kernel::AtomicFormula::AtomicFormula
                ((AtomicFormula *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 (Literal *)in_stack_ffffffffffffff28);
      bVar1 = true;
    }
  }
  while (bVar2 = Iterator::hasNext(in_stack_ffffffffffffff98), bVar2) {
    Iterator::next(in_stack_ffffffffffffff38);
    pGVar6 = Lib::SmartPtr<Shell::NewCNF::GenClause>::operator->
                       ((SmartPtr<Shell::NewCNF::GenClause> *)&stack0xffffffffffffff90);
    sig = (uchar *)(ulong)local_60;
    gl_00 = Lib::DArray<std::pair<Kernel::Formula_*,_bool>_>::operator[]
                      (&pGVar6->_literals,(size_t)sig);
    ppFVar7 = NewCNF::formula(gl_00);
    *ppFVar7 = local_10;
    if (bVar1) {
      tbs = local_10;
      iVar5 = NewCNF::sign((EVP_PKEY_CTX *)gl_00,sig,siglen,(uchar *)local_10,in_R8);
      bVar3 = *(byte *)CONCAT44(extraout_var,iVar5) ^ 1;
      iVar5 = NewCNF::sign((EVP_PKEY_CTX *)gl_00,sig,siglen_00,(uchar *)tbs,in_R8);
      in_stack_ffffffffffffff38 = (Iterator *)CONCAT44(extraout_var_00,iVar5);
      *(byte *)&(in_stack_ffffffffffffff38->_iterator)._lst = bVar3 & 1;
    }
    Occurrence::~Occurrence((Occurrence *)0xbe1af4);
  }
  Iterator::~Iterator((Iterator *)0xbe1b06);
  return;
}

Assistant:

void replaceBy(Formula* f) {
      Occurrences::Iterator occit(*this);

      bool negateOccurrenceSign = false;
      if (f->connective() == LITERAL) {
        Literal* l = f->literal();
        if (l->shared() && ((SIGN)l->polarity() != POSITIVE)) {
          f = new AtomicFormula(Literal::complementaryLiteral(l));
          negateOccurrenceSign = true;
        }
      }

      while (occit.hasNext()) {
        Occurrence occ = occit.next();
        GenLit& gl = occ.gc->_literals[occ.position];
        formula(gl) = f;
        if (negateOccurrenceSign) {
          sign(gl) = OPPOSITE(sign(gl));
        }
      }
    }